

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O1

void __thiscall
match_result_t::match_result_t
          (match_result_t *this,size_t key_bytes_matched_,size_t prefix_bytes_matched_,
          size_t edge_index_,size_t parent_edge_index_,node_t current_,node_t parent_,
          node_t grandparent_)

{
  this->_key_bytes_matched = key_bytes_matched_;
  this->_prefix_bytes_matched = prefix_bytes_matched_;
  this->_edge_index = edge_index_;
  this->_parent_edge_index = parent_edge_index_;
  (this->_current_node)._data = current_._data;
  (this->_parent_node)._data = parent_._data;
  (this->_grandparent_node)._data = grandparent_._data;
  return;
}

Assistant:

match_result_t::match_result_t (size_t key_bytes_matched_,
                                size_t prefix_bytes_matched_,
                                size_t edge_index_,
                                size_t parent_edge_index_,
                                node_t current_,
                                node_t parent_,
                                node_t grandparent_) :
    _key_bytes_matched (key_bytes_matched_),
    _prefix_bytes_matched (prefix_bytes_matched_),
    _edge_index (edge_index_),
    _parent_edge_index (parent_edge_index_),
    _current_node (current_),
    _parent_node (parent_),
    _grandparent_node (grandparent_)
{
}